

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void * mi_arena_area(mi_arena_id_t arena_id,size_t *size)

{
  mi_arena_t *pmVar1;
  ulong uVar2;
  
  if (size != (size_t *)0x0) {
    *size = 0;
  }
  uVar2 = 0x84;
  if (0 < arena_id) {
    uVar2 = (ulong)(arena_id - 1);
  }
  if (((uint)uVar2 < 0x84) && (pmVar1 = mi_arenas[uVar2], pmVar1 != (mi_arena_t *)0x0)) {
    if (size != (size_t *)0x0) {
      *size = pmVar1->block_count << 0x19;
    }
    return pmVar1->start;
  }
  return (void *)0x0;
}

Assistant:

void* mi_arena_area(mi_arena_id_t arena_id, size_t* size) {
  if (size != NULL) *size = 0;
  size_t arena_index = mi_arena_id_index(arena_id);
  if (arena_index >= MI_MAX_ARENAS) return NULL;
  mi_arena_t* arena = mi_atomic_load_ptr_acquire(mi_arena_t, &mi_arenas[arena_index]);
  if (arena == NULL) return NULL;
  if (size != NULL) { *size = mi_arena_block_size(arena->block_count); }
  return arena->start;
}